

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric.cpp
# Opt level: O1

Aggregate * __thiscall
hta::Metric::aggregate_interval
          (Aggregate *__return_storage_ptr__,Metric *this,TimePoint begin,TimePoint end,
          Duration interval)

{
  _Head_base<0UL,_hta::storage::Metric_*,_false> _Var1;
  TimeAggregate *r;
  void *pvVar2;
  vector<hta::TimeAggregate,_std::allocator<hta::TimeAggregate>_> rows;
  void *local_30;
  void *local_28;
  long local_20;
  
  if ((long)begin.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r % interval.__r != 0) {
    __assert_fail("begin.time_since_epoch().count() % interval.count() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                  ,0x8f,"Aggregate hta::Metric::aggregate_interval(TimePoint, TimePoint, Duration)")
    ;
  }
  if ((long)end.
            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .__d.__r % interval.__r == 0) {
    if ((long)begin.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r <=
        (long)end.
              super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              .__d.__r) {
      __return_storage_ptr__->minimum = INFINITY;
      __return_storage_ptr__->maximum = -INFINITY;
      __return_storage_ptr__->sum = 0.0;
      __return_storage_ptr__->count = 0;
      __return_storage_ptr__->integral = 0.0;
      (__return_storage_ptr__->active_time).__r = 0;
      if ((long)begin.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r <
          (long)end.
                super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                .__d.__r) {
        _Var1._M_head_impl =
             (this->storage_metric_)._M_t.
             super___uniq_ptr_impl<hta::storage::Metric,_std::default_delete<hta::storage::Metric>_>
             ._M_t.
             super__Tuple_impl<0UL,_hta::storage::Metric_*,_std::default_delete<hta::storage::Metric>_>
             .super__Head_base<0UL,_hta::storage::Metric_*,_false>._M_head_impl;
        (*(_Var1._M_head_impl)->_vptr_Metric[6])
                  (&local_30,_Var1._M_head_impl,
                   begin.
                   super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                   .__d.__r,end.
                            super_time_point<hta::Clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                            .__d.__r,interval.__r,1);
        for (pvVar2 = local_30; pvVar2 != local_28; pvVar2 = (void *)((long)pvVar2 + 0x38)) {
          Aggregate::operator+=(__return_storage_ptr__,*(Aggregate *)((long)pvVar2 + 8));
        }
        if (local_30 != (void *)0x0) {
          operator_delete(local_30,local_20 - (long)local_30);
        }
      }
      return __return_storage_ptr__;
    }
    __assert_fail("begin <= end",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                  ,0x91,"Aggregate hta::Metric::aggregate_interval(TimePoint, TimePoint, Duration)")
    ;
  }
  __assert_fail("end.time_since_epoch().count() % interval.count() == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/metricq[P]hta/src/metric.cpp"
                ,0x90,"Aggregate hta::Metric::aggregate_interval(TimePoint, TimePoint, Duration)");
}

Assistant:

Aggregate Metric::aggregate_interval(TimePoint begin, TimePoint end, Duration interval)
{
    // We assume that timestamps provided are aligned and ordered
    // to ensure that everything pieces together exactly
    assert(begin.time_since_epoch().count() % interval.count() == 0);
    assert(end.time_since_epoch().count() % interval.count() == 0);
    assert(begin <= end);

    Aggregate aggregate;
    if (begin < end) // we can avoid creating empty vectors in this case
    {
        auto rows =
            storage_metric_->get(begin, end, interval, IntervalScope{ Scope::closed, Scope::open });
        for (const auto& r : rows)
        {
            aggregate += r.aggregate;
        }
    }
    return aggregate;
}